

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

bool __thiscall
QAbstractItemViewPrivate::shouldForwardEvent
          (QAbstractItemViewPrivate *this,EditTrigger trigger,QEvent *event)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  QEvent *in_RDX;
  undefined8 in_RDI;
  QFlagsStorage<QAbstractItemView::EditTrigger> lhs;
  long in_FS_OFFSET;
  QFlags<QAbstractItemView::EditTrigger> in_stack_ffffffffffffffbc;
  EditTrigger in_stack_ffffffffffffffc0;
  undefined1 local_d;
  
  lhs.i = (Int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX != (QEvent *)0x0) {
    ::operator&(NoEditTriggers,in_stack_ffffffffffffffbc);
    bVar2 = ::operator!=((QFlags<QAbstractItemView::EditTrigger>)lhs.i,in_stack_ffffffffffffffc0);
    if (!bVar2) {
      TVar3 = QEvent::type(in_RDX);
      if (TVar3 - MouseButtonPress < 5) {
        local_d = true;
      }
      else {
        local_d = false;
      }
      goto LAB_0080a333;
    }
  }
  local_d = false;
LAB_0080a333:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_d;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemViewPrivate::shouldForwardEvent(QAbstractItemView::EditTrigger trigger,
                                                  const QEvent *event) const
{
    if (!event || (trigger & editTriggers) != QAbstractItemView::AnyKeyPressed)
        return false;

    switch (event->type()) {
        case QEvent::KeyPress:
        case QEvent::MouseButtonDblClick:
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonRelease:
        case QEvent::MouseMove:
            return true;
        default:
            break;
    };

    return false;
}